

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.cpp
# Opt level: O3

void __thiscall
vectorgraphics::Polygon3D::Polygon3D
          (Polygon3D *this,vector<double,_std::allocator<double>_> *coordinates)

{
  double dVar1;
  double dVar2;
  _func_int **pp_Var3;
  pointer psVar4;
  pointer pdVar5;
  pointer __args_1;
  long lVar6;
  ulong uVar7;
  undefined1 local_51;
  shared_ptr<vectorgraphics::LineSegment3D> local_50;
  vector<std::shared_ptr<vectorgraphics::LineSegment3D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>>>
  *local_40;
  vector<std::shared_ptr<vectorgraphics::Point3D>,std::allocator<std::shared_ptr<vectorgraphics::Point3D>>>
  *local_38;
  
  local_40 = (vector<std::shared_ptr<vectorgraphics::LineSegment3D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>>>
              *)&this->line_segment_ptrs_;
  local_38 = (vector<std::shared_ptr<vectorgraphics::Point3D>,std::allocator<std::shared_ptr<vectorgraphics::Point3D>>>
              *)&this->point_ptrs_;
  (this->point_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->point_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->point_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar5 = (coordinates->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __args_1 = (pointer)0x0;
  psVar4 = (pointer)0x0;
  if (0x10 < (ulong)((long)(coordinates->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5)) {
    uVar7 = 2;
    do {
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      (local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0010ecb8;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)
             (local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi + 1);
      dVar1 = pdVar5[uVar7];
      dVar2 = pdVar5[uVar7 - 2];
      pp_Var3 = (_func_int **)(pdVar5 + (uVar7 - 2))[1];
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._M_use_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._M_weak_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[3]._M_use_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[3]._M_weak_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._M_use_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._M_weak_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_use_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_weak_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(double *)
       &local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[5]._M_use_count = dVar2;
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[6]._vptr__Sp_counted_base = pp_Var3;
      *(double *)
       &local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[6]._M_use_count = dVar1;
      std::
      vector<std::shared_ptr<vectorgraphics::Point3D>,std::allocator<std::shared_ptr<vectorgraphics::Point3D>>>
      ::emplace_back<std::shared_ptr<vectorgraphics::Point3D>>
                (local_38,(shared_ptr<vectorgraphics::Point3D> *)&local_50);
      if (local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pdVar5 = (coordinates->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 3;
    } while (uVar7 < (ulong)((long)(coordinates->super__Vector_base<double,_std::allocator<double>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar5 >> 3))
    ;
    __args_1 = (this->point_ptrs_).
               super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->point_ptrs_).
             super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar7 = 1;
  if (0x10 < (ulong)((long)psVar4 - (long)__args_1)) {
    lVar6 = 0x10;
    do {
      local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<vectorgraphics::LineSegment3D,std::allocator<vectorgraphics::LineSegment3D>,std::shared_ptr<vectorgraphics::Point3D>&,std::shared_ptr<vectorgraphics::Point3D>&>
                (&local_50.
                  super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(LineSegment3D **)&local_50,
                 (allocator<vectorgraphics::LineSegment3D> *)&local_51,
                 (shared_ptr<vectorgraphics::Point3D> *)
                 ((long)&__args_1[-1].
                         super___shared_ptr<vectorgraphics::Point3D,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar6),
                 (shared_ptr<vectorgraphics::Point3D> *)
                 ((long)&(__args_1->
                         super___shared_ptr<vectorgraphics::Point3D,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr + lVar6));
      std::
      vector<std::shared_ptr<vectorgraphics::LineSegment3D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>>>
      ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment3D>>(local_40,&local_50);
      if (local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar7 = uVar7 + 1;
      __args_1 = (this->point_ptrs_).
                 super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)(this->point_ptrs_).
                                   super__Vector_base<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)__args_1 >> 4)
            );
  }
  local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vectorgraphics::LineSegment3D,std::allocator<vectorgraphics::LineSegment3D>,std::shared_ptr<vectorgraphics::Point3D>&,std::shared_ptr<vectorgraphics::Point3D>&>
            (&local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(LineSegment3D **)&local_50,
             (allocator<vectorgraphics::LineSegment3D> *)&local_51,__args_1 + (uVar7 - 1),__args_1);
  std::
  vector<std::shared_ptr<vectorgraphics::LineSegment3D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>>>
  ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment3D>>(local_40,&local_50);
  if (local_50.super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<vectorgraphics::LineSegment3D,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

Polygon3D::Polygon3D(std::vector<double> coordinates) {
    size_t index=0;
    while(index+2 < coordinates.size()) {
      point_ptrs_.push_back(std::make_shared<Point3D>(coordinates[index], coordinates[index+1], coordinates[index+2]));
      index += 3;
    }

    index = 1;
    while(index < point_ptrs_.size()) {
      line_segment_ptrs_.push_back(std::make_shared<LineSegment3D>(point_ptrs_[index-1], point_ptrs_[index]));
      index += 1;
    }
    line_segment_ptrs_.push_back(std::make_shared<LineSegment3D>(point_ptrs_[index-1], point_ptrs_[0]));
  }